

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_parse_body(http_s *h)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  FIOBJ FVar5;
  void *pvVar6;
  size_t sVar7;
  FIOBJ FVar8;
  FIOBJ hash;
  void *pvVar9;
  http_s *phVar10;
  http_s *phVar11;
  ulong uVar12;
  fiobj_object_vtable_s *pfVar13;
  ulong uVar14;
  char *pcVar15;
  long i;
  char *pcVar16;
  byte bVar17;
  FIOBJ *pobj;
  uint uVar19;
  char *pcVar20;
  char *offset;
  size_t sVar21;
  char *pcVar22;
  char *pcVar23;
  bool bVar24;
  uint uVar25;
  fio_str_info_s ret_2;
  fio_str_info_s ret_12;
  fio_str_info_s content_type;
  fio_str_info_s local_128;
  char *local_110;
  char *local_108;
  FIOBJ local_100;
  char *local_f8;
  char *local_f0;
  fio_str_info_s local_e8;
  char *local_d0;
  http_s *local_c8;
  ulong local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  ulong local_a0;
  fio_str_info_s local_98;
  undefined8 local_78;
  ulong local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  long local_48;
  ulong local_40;
  char *local_38;
  http_s *phVar18;
  
  if (h->body == 0) {
    return -1;
  }
  if (http_parse_body::content_type_hash == 0) {
    http_parse_body::content_type_hash = fio_siphash13("content-type",0xc,0x1456f2,0x145bc9);
  }
  FVar5 = fiobj_hash_get2(h->headers,http_parse_body::content_type_hash);
  if (FVar5 == 0) {
LAB_0014bdec:
    local_98.data = anon_var_dwarf_20c;
    uVar19 = 4;
    goto LAB_0014be02;
  }
  cVar1 = (char)FVar5;
  if ((FVar5 & 1) == 0) {
    switch((uint)FVar5 & 6) {
    case 0:
      cVar1 = *(char *)(FVar5 & 0xfffffffffffffff8);
LAB_0014bd66:
      switch(cVar1) {
      case '\'':
        pfVar13 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_0014bd5b_caseD_2;
      case ')':
        pfVar13 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_0014bd5b_caseD_4;
      case '+':
        pfVar13 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar13 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_0014bd5b_caseD_2:
      pfVar13 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_0014bd5b_caseD_4:
      pfVar13 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar1 == '&') {
        local_98.data = anon_var_dwarf_217;
        uVar19 = 5;
      }
      else {
        uVar19 = (uint)FVar5 & 0xff;
        if (uVar19 != 0x16) {
          if (uVar19 == 6) goto LAB_0014bdec;
          goto LAB_0014bd66;
        }
        local_98.data = anon_var_dwarf_222;
        uVar19 = 4;
      }
LAB_0014be02:
      local_98.capa = 0;
      local_98.len = (size_t)uVar19;
      goto LAB_0014be0a;
    }
    (*pfVar13->to_str)(&local_98,FVar5);
  }
  else {
    fio_ltocstr(&local_98,(long)FVar5 >> 1);
  }
LAB_0014be0a:
  pcVar16 = local_98.data;
  pcVar22 = (char *)local_98.len;
  iVar4 = -1;
  if (local_98.len < (char *)0x10) {
    return -1;
  }
  if (((char *)0x20 < local_98.len) &&
     (iVar3 = strncasecmp("application/x-www-form-urlencoded",local_98.data,0x21), iVar3 == 0)) {
    if (h->params == 0) {
      FVar5 = fiobj_hash_new();
      h->params = FVar5;
    }
    FVar5 = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = FVar5;
    return 0;
  }
  iVar3 = strncasecmp("application/json",pcVar16,0x10);
  if (iVar3 != 0) {
    iVar4 = strncasecmp("multipart/form",pcVar16,0xe);
    if (iVar4 != 0) {
      return -1;
    }
    pvVar6 = memchr(pcVar16,0x3b,(size_t)pcVar22);
    if (pvVar6 == (void *)0x0) {
      return -1;
    }
    while( true ) {
      if (pcVar16 + (long)(pcVar22 + ~(ulong)pvVar6) == (char *)0x0) {
        return -1;
      }
      pcVar15 = (char *)0x0;
      while (pcVar15[(long)pvVar6 + 1] == ' ') {
        pcVar15 = pcVar15 + 1;
        if (pcVar16 + (long)(pcVar22 + ~(ulong)pvVar6) == pcVar15) {
          return -1;
        }
      }
      pcVar20 = pcVar16 + (long)(pcVar22 + (~(ulong)pcVar15 - (long)pvVar6));
      if (pcVar20 < (char *)0xa) {
        return -1;
      }
      pcVar23 = (char *)((long)pvVar6 + (long)pcVar15) + 1;
      iVar4 = strncasecmp("boundary=",pcVar23,9);
      if (iVar4 == 0) break;
      pvVar6 = memchr(pcVar23,0x3b,(size_t)pcVar20);
      pcVar22 = pcVar20;
      pcVar16 = pcVar23;
      if (pvVar6 == (void *)0x0) {
        return -1;
      }
    }
    local_60 = (char *)((long)pvVar6 + (long)pcVar15) + 10;
    pvVar9 = memchr(local_60,0x3b,
                    (size_t)(pcVar16 + (long)(pcVar22 + (-(long)pcVar15 - (long)pvVar6) + -10)));
    local_a8 = (char *)((long)pvVar9 + (-(long)pcVar15 - (long)pvVar6) + -10);
    if (pvVar9 == (void *)0x0) {
      local_a8 = pcVar16 + (long)(pcVar22 + (-(long)pcVar15 - (long)pvVar6) + -10);
    }
    if (h->params == 0) {
      FVar5 = fiobj_hash_new();
      h->params = FVar5;
    }
    local_58 = local_a8 + 4;
    local_38 = local_a8 + 5;
    local_78 = 0;
    pcVar16 = (char *)0x0;
    local_b8 = (char *)0x0;
    local_108 = (char *)0x0;
    local_100 = 0;
    pcVar22 = (char *)0x0;
    pcVar15 = (char *)0x0;
    phVar10 = h;
LAB_0014c216:
    if (pcVar15 != (char *)0x0) {
      local_f8 = pcVar22 + (long)pcVar15;
      phVar10 = (http_s *)CONCAT71((int7)((ulong)phVar10 >> 8),(char)local_78 == '\0');
      local_48 = (long)pcVar16 - (long)pcVar22;
      local_110 = pcVar22;
      local_f0 = pcVar16;
      local_50 = pcVar15;
LAB_0014c257:
      pcVar15 = local_f8;
      if ((char)phVar10 == '\0') {
        sVar21 = (long)local_f8 - (long)pcVar22;
        pvVar6 = memchr(pcVar22,10,sVar21);
        while( true ) {
          if (pvVar6 == (void *)0x0) {
            pcVar16 = local_f8;
            if (pcVar15 == pcVar22) goto LAB_0014d308;
            goto LAB_0014d279;
          }
          pcVar20 = (char *)((long)pvVar6 + 1);
          if ((pcVar15 + -(long)pcVar20 < local_58) ||
             (((*pcVar20 == '-' && (*(char *)((long)pvVar6 + 2) == '-')) &&
              (iVar4 = bcmp((void *)((long)pvVar6 + 3),local_60,(size_t)local_a8), iVar4 == 0))))
          break;
          pvVar6 = memchr(pcVar20,10,(size_t)(pcVar15 + -(long)pcVar20));
          pcVar15 = local_f8;
        }
        pcVar16 = local_f0;
        pcVar15 = local_f8;
        if (local_f8 <= (char *)((long)pvVar6 + (long)(local_a8 + 5))) {
          pcVar16 = (char *)((long)pvVar6 + -1);
          if (*(char *)((long)pvVar6 + -1) == '\r') {
            pcVar16 = (char *)((long)pvVar6 + -2);
          }
          sVar21 = (long)pcVar16 - (long)pcVar22;
          pcVar15 = pcVar22;
          if (sVar21 == 0) {
LAB_0014d308:
            bVar24 = true;
            uVar14 = 1;
            pcVar20 = local_110;
            pcVar16 = local_f0;
            pcVar22 = pcVar15;
          }
          else {
LAB_0014d279:
            local_f8 = pcVar16;
            if (local_b8 == (char *)0x0) {
              local_b8 = pcVar22 + local_48;
            }
            local_108 = local_108 + sVar21;
            bVar24 = true;
            uVar14 = 1;
            pcVar20 = local_110;
            pcVar16 = local_f0;
            pcVar22 = local_f8;
          }
          goto LAB_0014d3c8;
        }
        pcVar23 = pcVar20 + (~(ulong)pcVar22 - 1);
        if ((pcVar22 + -1)[(long)(pcVar20 + ~(ulong)pcVar22)] != '\r') {
          pcVar23 = pcVar20 + ~(ulong)pcVar22;
        }
        offset = pcVar22 + local_48;
        if (local_b8 != (char *)0x0) {
          offset = local_b8;
        }
        if (pcVar23 == (char *)0x0) {
          offset = local_b8;
        }
        local_d0 = pcVar20;
        if (local_100 == 0) {
          local_128.data = anon_var_dwarf_20c;
          local_128.capa = 0;
          local_128.len = 4;
        }
        else if ((local_100 & 1) == 0) {
          switch((uint)local_100 & 6) {
          case 0:
            cVar1 = *(char *)(local_100 & 0xfffffffffffffff8);
LAB_0014c3d3:
            pfVar13 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar1) {
            case '\'':
              pfVar13 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_0014c3c6_caseD_2;
            case ')':
              pfVar13 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_0014c3c6_caseD_4;
            case '+':
              pfVar13 = &FIOBJECT_VTABLE_DATA;
            }
            break;
          case 2:
switchD_0014c3c6_caseD_2:
            pfVar13 = &FIOBJECT_VTABLE_STRING;
            break;
          case 4:
switchD_0014c3c6_caseD_4:
            pfVar13 = &FIOBJECT_VTABLE_HASH;
            break;
          case 6:
            cVar1 = (char)local_100;
            if (cVar1 == '&') {
              local_128.data = anon_var_dwarf_217;
              uVar19 = 5;
            }
            else {
              uVar19 = (uint)local_100 & 0xff;
              if (uVar19 == 0x16) {
                local_128.data = anon_var_dwarf_222;
                uVar19 = 4;
              }
              else {
                if (uVar19 != 6) goto LAB_0014c3d3;
                local_128.data = anon_var_dwarf_20c;
                uVar19 = 4;
              }
            }
            local_128.capa = 0;
            local_128.len = (size_t)uVar19;
            goto LAB_0014c449;
          }
          (*pfVar13->to_str)(&local_128,local_100);
        }
        else {
          fio_ltocstr(&local_128,(long)local_100 >> 1);
        }
LAB_0014c449:
        local_108 = pcVar23 + (long)local_108;
        if (local_108 != (char *)0x0) {
          if (local_108 < (char *)0x2a) {
            FVar5 = fiobj_str_new(offset + (long)local_110,(size_t)local_108);
          }
          else {
            FVar5 = fiobj_data_slice(h->body,(intptr_t)offset,(uintptr_t)local_108);
          }
          http_add2hash2(h->params,local_128.data,local_128.len,FVar5,'\0');
          fiobj_free(local_100);
          offset = (char *)0x0;
          local_100 = 0;
        }
        local_78 = 0;
        pcVar22 = local_d0;
        local_b8 = offset;
      }
      else {
        bVar24 = true;
        if (((local_50 < local_58) || (*pcVar22 != '-')) || (pcVar22[1] != '-')) {
          uVar14 = 0;
          pcVar20 = local_110;
          goto LAB_0014d3c8;
        }
        iVar4 = bcmp(pcVar22 + 2,local_60,(size_t)local_a8);
        pcVar15 = local_f8;
        if (iVar4 != 0) {
          uVar14 = 0;
          pcVar20 = local_110;
          goto LAB_0014d3c8;
        }
      }
      uVar14 = 1;
      if (pcVar22 < pcVar15) {
        uVar12 = (ulong)phVar10 ^ 1;
        do {
          uVar14 = 1;
          if (pcVar22[(long)(local_a8 + 2)] == '-') {
            cVar1 = pcVar22[(long)(local_a8 + 3)];
            if (cVar1 == '-') {
              pcVar22 = pcVar22 + (long)local_38;
              pcVar20 = local_110;
              if (pcVar15 < pcVar22) {
                bVar24 = false;
                pcVar22 = pcVar15;
              }
              else if (pcVar22 < pcVar15) {
                bVar24 = false;
                pcVar22 = pcVar22 + (*pcVar22 == '\n');
              }
              else {
                bVar24 = false;
              }
              goto LAB_0014d3c8;
            }
          }
          else {
            cVar1 = pcVar22[(long)(local_a8 + 3)];
          }
          pcVar16 = pcVar22 + (long)(local_a8 + (ulong)(cVar1 == '\n') + 3);
          local_c8 = (http_s *)0x0;
          local_70 = 0;
          local_b0 = (char *)0x0;
          local_c0 = 0;
          local_68 = (char *)0x0;
          local_a0 = 0;
          phVar18 = (http_s *)0x0;
          pcVar23 = local_108;
          local_d0 = pcVar22;
          local_40 = uVar12;
          while (phVar10 = local_c8, pcVar16 + 4 < pcVar15) {
            if ((*pcVar16 == '\n') || (pcVar16[1] == '\n')) {
              phVar18 = local_c8;
              if (local_c8 == (http_s *)0x0) goto LAB_0014d2e2;
              goto LAB_0014c8c9;
            }
            phVar10 = (http_s *)memchr(pcVar16,10,(long)pcVar15 - (long)pcVar16);
            if (phVar10 == (http_s *)0x0) {
              uVar14 = local_40 & 0xffffffff;
              local_108 = pcVar23;
              goto LAB_0014d2f1;
            }
            if ((long)phVar10 - (long)pcVar16 < 0x1e) {
              if (0xe < (long)phVar10 - (long)pcVar16) goto LAB_0014c812;
            }
            else {
              iVar4 = strncasecmp(pcVar16,"content-disposition:",0x14);
              if (iVar4 == 0) {
                pvVar6 = memchr(pcVar16 + 0x14,0x3b,(long)phVar10 - (long)(pcVar16 + 0x14));
joined_r0x0014c5f5:
                if (pvVar6 != (void *)0x0) {
                  do {
                    pcVar22 = (char *)((long)pvVar6 + 1);
                    if (*(char *)((long)pvVar6 + 1) == ' ') {
                      pcVar22 = (char *)((long)pvVar6 + 2);
                    }
                    if (((http_s *)(pcVar22 + 6) < phVar10) &&
                       (iVar4 = strncasecmp(pcVar22,"name=",5), iVar4 == 0)) {
                      phVar11 = (http_s *)(pcVar22 + 5);
                      if (pcVar22[5] == '\"') {
                        phVar11 = (http_s *)(pcVar22 + 6);
                      }
                      pvVar6 = memchr(phVar11,0x3b,(long)phVar10 - (long)pcVar22);
                      if (pvVar6 == (void *)0x0) {
                        iVar4 = (int)phVar10 - (int)phVar11;
                        uVar19 = iVar4 - (uint)(*(char *)((long)&(phVar11->private_data).vtbl +
                                                         (ulong)(iVar4 - 1)) == '\r');
                      }
                      else {
                        uVar19 = (int)pvVar6 - (int)phVar11;
                      }
                      if (*(char *)((long)&(phVar11->private_data).vtbl + (ulong)(uVar19 - 1)) ==
                          '\"') {
                        uVar19 = uVar19 - 1;
                      }
                      local_70 = (ulong)uVar19;
                      local_c8 = phVar11;
                      pcVar22 = local_b0;
                    }
                    else if (((http_s *)(pcVar22 + 9) < phVar10) &&
                            (iVar4 = strncasecmp(pcVar22,"filename",8), iVar4 == 0)) {
                      cVar1 = pcVar22[8];
                      phVar11 = (http_s *)(pcVar22 + 8);
                      if (cVar1 == '*') {
                        phVar11 = (http_s *)(pcVar22 + 9);
                      }
                      if (pcVar22[(ulong)(cVar1 == '*') + 8] != '=') {
                        uVar14 = 0;
                        goto LAB_0014d2f1;
                      }
                      bVar24 = *(char *)((long)&(phVar11->private_data).vtbl + 1) == ' ';
                      pcVar22 = (char *)((long)&(phVar11->private_data).vtbl + 1);
                      if (bVar24) {
                        pcVar22 = (char *)((long)&(phVar11->private_data).vtbl + 2);
                      }
                      pcVar22 = pcVar22 + (*(char *)((long)&(phVar11->private_data).vtbl +
                                                    (ulong)bVar24 + 1) == '\"');
                      sVar21 = (long)phVar10 - (long)pcVar22;
                      if ((local_b0 != (char *)0x0) && (cVar1 != '*')) goto code_r0x0014c6b0;
                      pvVar6 = memchr(pcVar22,0x3b,sVar21);
                      if (pvVar6 == (void *)0x0) {
                        uVar19 = (int)sVar21 - (uint)(pcVar22[(int)sVar21 - 1] == '\r');
                      }
                      else {
                        uVar19 = (int)pvVar6 - (int)pcVar22;
                      }
                      if (pcVar22[uVar19 - 1] == '\"') {
                        uVar19 = uVar19 - 1;
                      }
                      uVar14 = (ulong)uVar19;
                      local_c0 = uVar14;
                      if (cVar1 == '*') {
                        uVar12 = http_decode_url(pcVar22,pcVar22,uVar14);
                        if ((long)uVar12 < 1) {
                          uVar12 = uVar14;
                        }
                        local_c0 = uVar12 & 0xffffffff;
                      }
                    }
                    else {
                      pvVar6 = memchr(pcVar22,0x3b,(long)phVar10 - (long)pcVar22);
                      pcVar22 = local_b0;
                    }
                    local_b0 = pcVar22;
                    pcVar23 = local_108;
                    pcVar15 = local_f8;
                    if (pvVar6 == (void *)0x0) break;
                  } while( true );
                }
                goto LAB_0014c894;
              }
LAB_0014c812:
              iVar4 = strncasecmp(pcVar16,"content-type:",0xd);
              if (iVar4 == 0) {
                pcVar22 = pcVar16 + 0xd;
                if (pcVar16[0xd] == ' ') {
                  pcVar22 = pcVar16 + 0xe;
                }
                pvVar6 = memchr(pcVar22,0x3b,(long)phVar10 - (long)pcVar22);
                local_68 = pcVar22;
                if (pvVar6 == (void *)0x0) {
                  iVar4 = (int)((long)phVar10 - (long)pcVar22);
                  local_a0 = (ulong)(iVar4 - (uint)(pcVar22[iVar4 - 1] == '\r'));
                }
                else {
                  local_a0 = (ulong)(uint)((int)pvVar6 - (int)pcVar22);
                }
              }
            }
LAB_0014c894:
            pcVar16 = (char *)((long)&(phVar10->private_data).vtbl + 1);
            bVar17 = (char)phVar18 + 1;
            phVar18 = (http_s *)(ulong)bVar17;
            if (bVar17 == 6) {
LAB_0014d2e2:
              uVar14 = 0;
              local_108 = pcVar23;
LAB_0014d2f1:
              bVar24 = true;
              pcVar20 = local_110;
              pcVar16 = local_f0;
              phVar10 = phVar18;
              pcVar22 = local_d0;
              goto LAB_0014d3c8;
            }
          }
          if (local_c8 == (http_s *)0x0) {
            bVar24 = true;
            uVar14 = 1;
            pcVar20 = local_110;
            pcVar16 = local_f0;
            pcVar22 = local_d0;
            local_108 = pcVar23;
            goto LAB_0014d3c8;
          }
LAB_0014c8c9:
          pcVar20 = pcVar16 + 1;
          if (pcVar16[1] == '\n') {
            pcVar20 = pcVar16 + 2;
          }
          pvVar6 = memchr(pcVar20,10,(long)pcVar15 - (long)pcVar20);
          uVar14 = 1;
          while( true ) {
            if (pvVar6 == (void *)0x0) goto LAB_0014ce1b;
            pcVar22 = (char *)((long)pvVar6 + 1);
            pcVar16 = local_f8 + -(long)pcVar22;
            if ((pcVar16 < local_58) ||
               (((*pcVar22 == '-' && (*(char *)((long)pvVar6 + 2) == '-')) &&
                (iVar4 = bcmp((void *)((long)pvVar6 + 3),local_60,(size_t)local_a8), iVar4 == 0))))
            break;
            pvVar6 = memchr(pcVar22,10,(size_t)pcVar16);
          }
          if (local_f8 <= (char *)((long)pvVar6 + (long)(local_a8 + 5))) goto LAB_0014ce1b;
          pcVar16 = pcVar22 + ~(ulong)pcVar20;
          uVar19 = (uint)pcVar16;
          if (pcVar20[(ulong)(pcVar16 + 0xffffffff) & 0xffffffff] == '\r') {
            uVar19 = (uint)(pcVar16 + 0xffffffff);
          }
          pcVar16 = (char *)(local_70 & 0xffffffff);
          if ((int)local_c0 == 0) {
            http_add2hash(h->params,(char *)phVar10,(size_t)pcVar16,pcVar20,(size_t)(ulong)uVar19,
                          '\0');
            pcVar15 = local_f8;
            pcVar16 = local_f0;
          }
          else {
            local_d0 = pcVar16;
            local_c8 = (http_s *)(ulong)uVar19;
            phVar10 = (http_s *)fiobj_str_new((char *)phVar10,(size_t)pcVar16);
            fiobj_str_write((FIOBJ)phVar10,"[data]",6);
            pcVar16 = local_f0;
            pcVar15 = local_f8;
            cVar1 = (char)phVar10;
            uVar19 = (uint)phVar10;
            i = (long)phVar10 >> 1;
            if (phVar10 == (http_s *)0x0) {
LAB_0014caa9:
              local_128.data = anon_var_dwarf_20c;
              uVar25 = 4;
              goto LAB_0014cabc;
            }
            if (((ulong)phVar10 & 1) == 0) {
              switch(uVar19 & 6) {
              case 0:
                cVar2 = *(char *)((ulong)phVar10 & 0xfffffffffffffff8);
LAB_0014ca06:
                pfVar13 = &FIOBJECT_VTABLE_NUMBER;
                switch(cVar2) {
                case '\'':
                  pfVar13 = &FIOBJECT_VTABLE_FLOAT;
                  break;
                case '(':
                  goto switchD_0014c9fb_caseD_2;
                case ')':
                  pfVar13 = &FIOBJECT_VTABLE_ARRAY;
                  break;
                case '*':
                  goto switchD_0014c9fb_caseD_4;
                case '+':
                  pfVar13 = &FIOBJECT_VTABLE_DATA;
                }
                break;
              case 2:
switchD_0014c9fb_caseD_2:
                pfVar13 = &FIOBJECT_VTABLE_STRING;
                break;
              case 4:
switchD_0014c9fb_caseD_4:
                pfVar13 = &FIOBJECT_VTABLE_HASH;
                break;
              case 6:
                if (cVar1 == '&') {
                  local_128.data = anon_var_dwarf_217;
                  uVar25 = 5;
                }
                else {
                  if ((uVar19 & 0xff) != 0x16) {
                    cVar2 = cVar1;
                    if ((uVar19 & 0xff) == 6) goto LAB_0014caa9;
                    goto LAB_0014ca06;
                  }
                  local_128.data = anon_var_dwarf_222;
                  uVar25 = 4;
                }
LAB_0014cabc:
                local_128.capa = 0;
                local_128.len = (size_t)uVar25;
                goto LAB_0014cac1;
              }
              (*pfVar13->to_str)(&local_128,(FIOBJ)phVar10);
            }
            else {
              fio_ltocstr(&local_128,i);
            }
LAB_0014cac1:
            http_add2hash(h->params,local_128.data,local_128.len,pcVar20,(size_t)local_c8,'\0');
            fiobj_str_resize((FIOBJ)phVar10,(size_t)local_d0);
            fiobj_str_write((FIOBJ)phVar10,"[name]",6);
            if (phVar10 == (http_s *)0x0) {
LAB_0014cbac:
              local_e8.data = anon_var_dwarf_20c;
              uVar25 = 4;
              goto LAB_0014cbbf;
            }
            if (((ulong)phVar10 & 1) == 0) {
              switch(uVar19 & 6) {
              case 0:
                cVar2 = *(char *)((ulong)phVar10 & 0xfffffffffffffff8);
LAB_0014cb33:
                pfVar13 = &FIOBJECT_VTABLE_NUMBER;
                switch(cVar2) {
                case '\'':
                  pfVar13 = &FIOBJECT_VTABLE_FLOAT;
                  break;
                case '(':
                  goto switchD_0014cb28_caseD_2;
                case ')':
                  pfVar13 = &FIOBJECT_VTABLE_ARRAY;
                  break;
                case '*':
                  goto switchD_0014cb28_caseD_4;
                case '+':
                  pfVar13 = &FIOBJECT_VTABLE_DATA;
                }
                break;
              case 2:
switchD_0014cb28_caseD_2:
                pfVar13 = &FIOBJECT_VTABLE_STRING;
                break;
              case 4:
switchD_0014cb28_caseD_4:
                pfVar13 = &FIOBJECT_VTABLE_HASH;
                break;
              case 6:
                if (cVar1 == '&') {
                  local_e8.data = anon_var_dwarf_217;
                  uVar25 = 5;
                }
                else {
                  if ((uVar19 & 0xff) != 0x16) {
                    cVar2 = cVar1;
                    if ((uVar19 & 0xff) == 6) goto LAB_0014cbac;
                    goto LAB_0014cb33;
                  }
                  local_e8.data = anon_var_dwarf_222;
                  uVar25 = 4;
                }
LAB_0014cbbf:
                local_e8.capa = 0;
                local_e8.len = (size_t)uVar25;
                goto LAB_0014cbc4;
              }
              (*pfVar13->to_str)(&local_e8,(FIOBJ)phVar10);
            }
            else {
              fio_ltocstr(&local_e8,i);
            }
LAB_0014cbc4:
            local_128.data = local_e8.data;
            local_128.capa = local_e8.capa;
            local_128.len = local_e8.len;
            pcVar20 = local_b0;
            http_add2hash(h->params,local_e8.data,local_e8.len,local_b0,local_c0 & 0xffffffff,'\0');
            if ((int)local_a0 != 0) {
              fiobj_str_resize((FIOBJ)phVar10,(size_t)local_d0);
              fiobj_str_write((FIOBJ)phVar10,"[type]",6);
              if (phVar10 == (http_s *)0x0) {
LAB_0014ccd1:
                local_e8.data = anon_var_dwarf_20c;
                uVar19 = 4;
                goto LAB_0014cce4;
              }
              if (((ulong)phVar10 & 1) == 0) {
                switch(uVar19 & 6) {
                case 0:
                  cVar1 = *(char *)((ulong)phVar10 & 0xfffffffffffffff8);
LAB_0014cc58:
                  pfVar13 = &FIOBJECT_VTABLE_NUMBER;
                  switch(cVar1) {
                  case '\'':
                    pfVar13 = &FIOBJECT_VTABLE_FLOAT;
                    break;
                  case '(':
                    goto switchD_0014cc4d_caseD_2;
                  case ')':
                    pfVar13 = &FIOBJECT_VTABLE_ARRAY;
                    break;
                  case '*':
                    goto switchD_0014cc4d_caseD_4;
                  case '+':
                    pfVar13 = &FIOBJECT_VTABLE_DATA;
                  }
                  break;
                case 2:
switchD_0014cc4d_caseD_2:
                  pfVar13 = &FIOBJECT_VTABLE_STRING;
                  break;
                case 4:
switchD_0014cc4d_caseD_4:
                  pfVar13 = &FIOBJECT_VTABLE_HASH;
                  break;
                case 6:
                  if (cVar1 == '&') {
                    local_e8.data = anon_var_dwarf_217;
                    uVar19 = 5;
                  }
                  else {
                    if ((uVar19 & 0xff) != 0x16) {
                      if ((uVar19 & 0xff) == 6) goto LAB_0014ccd1;
                      goto LAB_0014cc58;
                    }
                    local_e8.data = anon_var_dwarf_222;
                    uVar19 = 4;
                  }
LAB_0014cce4:
                  local_e8.capa = 0;
                  local_e8.len = (size_t)uVar19;
                  goto LAB_0014cce9;
                }
                (*pfVar13->to_str)(&local_e8,(FIOBJ)phVar10);
              }
              else {
                fio_ltocstr(&local_e8,i);
              }
LAB_0014cce9:
              local_128.data = local_e8.data;
              local_128.capa = local_e8.capa;
              local_128.len = local_e8.len;
              pcVar20 = local_68;
              http_add2hash(h->params,local_e8.data,local_e8.len,local_68,local_a0 & 0xffffffff,'\0'
                           );
            }
            fiobj_free((FIOBJ)phVar10);
          }
          uVar12 = CONCAT71((int7)((ulong)pcVar20 >> 8),1);
          if (pcVar15 <= pcVar22) {
            bVar24 = true;
            uVar14 = 1;
            pcVar20 = local_110;
            goto LAB_0014d3c8;
          }
        } while( true );
      }
      bVar24 = true;
      pcVar20 = local_110;
      goto LAB_0014d3c8;
    }
    bVar24 = true;
    uVar14 = 1;
    pcVar20 = pcVar22;
    goto LAB_0014d3c8;
  }
  uVar14 = h->body;
  if (uVar14 == 0) {
LAB_0014c06b:
    local_128.data = anon_var_dwarf_20c;
    uVar19 = 4;
    goto LAB_0014c07e;
  }
  cVar1 = (char)uVar14;
  if ((uVar14 & 1) != 0) {
    fio_ltocstr(&local_128,(long)uVar14 >> 1);
    goto LAB_0014c083;
  }
  switch((uint)uVar14 & 6) {
  case 0:
    cVar1 = *(char *)(uVar14 & 0xfffffffffffffff8);
LAB_0014bf69:
    switch(cVar1) {
    case '\'':
      pfVar13 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0014bf5e_caseD_2;
    case ')':
      pfVar13 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0014bf5e_caseD_4;
    case '+':
      pfVar13 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar13 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_0014bf5e_caseD_2:
    pfVar13 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0014bf5e_caseD_4:
    pfVar13 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar1 == '&') {
      local_128.data = anon_var_dwarf_217;
      uVar19 = 5;
    }
    else {
      uVar19 = (uint)uVar14 & 0xff;
      if (uVar19 != 0x16) {
        if (uVar19 == 6) goto LAB_0014c06b;
        goto LAB_0014bf69;
      }
      local_128.data = anon_var_dwarf_222;
      uVar19 = 4;
    }
LAB_0014c07e:
    local_128.capa = 0;
    local_128.len = (size_t)uVar19;
    goto LAB_0014c083;
  }
  (*pfVar13->to_str)(&local_128,uVar14);
LAB_0014c083:
  local_98.data = local_128.data;
  local_98.capa = local_128.capa;
  local_98.len = local_128.len;
  if (h->params == 0) {
    pobj = &h->params;
    sVar7 = fiobj_json2obj(pobj,local_128.data,local_128.len);
    if (sVar7 != 0) {
      FVar5 = *pobj;
      iVar4 = 0;
      if (((uint)FVar5 & 7) != 4) {
        FVar8 = fiobj_str_new("JSON",4);
        hash = fiobj_hash_new2(4);
        *pobj = hash;
        fiobj_hash_set(hash,FVar8,FVar5);
        fiobj_free(FVar8);
      }
    }
  }
  return iVar4;
code_r0x0014c6b0:
  pvVar6 = memchr(local_b0,0x3b,sVar21);
  pcVar23 = local_108;
  pcVar15 = local_f8;
  goto joined_r0x0014c5f5;
LAB_0014ce1b:
  pcVar16 = local_f0;
  if ((local_40 & 1) != 0) goto LAB_0014d392;
  uVar14 = local_70 & 0xffffffff;
  FVar5 = fiobj_str_new((char *)phVar10,uVar14);
  local_78 = CONCAT71((int7)(FVar5 >> 8),1);
  local_b8 = (char *)0x0;
  local_108 = (char *)0x0;
  phVar10 = (http_s *)0x0;
  pcVar22 = pcVar20;
  local_100 = FVar5;
  if (local_b0 == (char *)0x0) goto LAB_0014c257;
  fiobj_str_write(FVar5,"[type]",6);
  FVar8 = local_100;
  if (FVar5 == 0) {
    local_128.data = anon_var_dwarf_20c;
    uVar19 = 4;
    FVar8 = FVar5;
    goto LAB_0014cf13;
  }
  if ((FVar5 & 1) == 0) {
    switch((uint)FVar5 & 6) {
    case 0:
      cVar1 = *(char *)(local_100 & 0xfffffffffffffff8);
LAB_0014ced1:
      pfVar13 = &FIOBJECT_VTABLE_NUMBER;
      switch(cVar1) {
      case '\'':
        pfVar13 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_0014cec4_caseD_2;
      case ')':
        pfVar13 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_0014cec4_caseD_4;
      case '+':
        pfVar13 = &FIOBJECT_VTABLE_DATA;
      }
      break;
    case 2:
switchD_0014cec4_caseD_2:
      pfVar13 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_0014cec4_caseD_4:
      pfVar13 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      cVar1 = (char)local_100;
      if (cVar1 == '&') {
        local_128.data = anon_var_dwarf_217;
        uVar19 = 5;
      }
      else {
        uVar19 = (uint)local_100 & 0xff;
        if (uVar19 != 0x16) {
          if (uVar19 == 6) {
            local_128.data = anon_var_dwarf_20c;
            local_128.capa = 0;
            local_128.len = 4;
            goto LAB_0014cf86;
          }
          goto LAB_0014ced1;
        }
        local_128.data = anon_var_dwarf_222;
        uVar19 = 4;
      }
LAB_0014cf13:
      local_128.capa = 0;
      local_128.len = (size_t)uVar19;
      goto LAB_0014cf86;
    }
    (*pfVar13->to_str)(&local_128,local_100);
  }
  else {
    fio_ltocstr(&local_128,(long)FVar5 >> 1);
    FVar8 = FVar5;
  }
LAB_0014cf86:
  http_add2hash(h->params,local_128.data,local_128.len,local_68,local_a0 & 0xffffffff,'\0');
  fiobj_str_resize(FVar8,uVar14);
  fiobj_str_write(FVar8,"[name]",6);
  FVar5 = local_100;
  if (FVar8 == 0) {
    local_e8.data = anon_var_dwarf_20c;
    uVar19 = 4;
    FVar5 = FVar8;
    goto LAB_0014d039;
  }
  if ((FVar8 & 1) != 0) {
    fio_ltocstr(&local_e8,(long)FVar8 >> 1);
    FVar5 = FVar8;
    goto LAB_0014d072;
  }
  switch((uint)FVar8 & 6) {
  case 0:
    cVar1 = *(char *)(local_100 & 0xfffffffffffffff8);
LAB_0014cffb:
    pfVar13 = &FIOBJECT_VTABLE_NUMBER;
    switch(cVar1) {
    case '\'':
      pfVar13 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0014cfee_caseD_2;
    case ')':
      pfVar13 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0014cfee_caseD_4;
    case '+':
      pfVar13 = &FIOBJECT_VTABLE_DATA;
    }
    break;
  case 2:
switchD_0014cfee_caseD_2:
    pfVar13 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0014cfee_caseD_4:
    pfVar13 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    cVar1 = (char)local_100;
    if (cVar1 == '&') {
      local_e8.data = anon_var_dwarf_217;
      uVar19 = 5;
    }
    else {
      uVar19 = (uint)local_100 & 0xff;
      if (uVar19 != 0x16) {
        if (uVar19 == 6) {
          local_e8.data = anon_var_dwarf_20c;
          local_e8.capa = 0;
          local_e8.len = 4;
          goto LAB_0014d072;
        }
        goto LAB_0014cffb;
      }
      local_e8.data = anon_var_dwarf_222;
      uVar19 = 4;
    }
LAB_0014d039:
    local_e8.capa = 0;
    local_e8.len = (size_t)uVar19;
    goto LAB_0014d072;
  }
  (*pfVar13->to_str)(&local_e8,local_100);
LAB_0014d072:
  local_128.data = local_e8.data;
  local_128.capa = local_e8.capa;
  local_128.len = local_e8.len;
  local_b8 = (char *)0x0;
  http_add2hash(h->params,local_e8.data,local_e8.len,local_b0,local_c0 & 0xffffffff,'\0');
  fiobj_str_resize(FVar5,uVar14);
  fiobj_str_write(FVar5,"[data]",6);
  local_108 = (char *)0x0;
  phVar10 = (http_s *)0x0;
  goto LAB_0014c257;
LAB_0014d392:
  bVar24 = true;
  pcVar20 = local_110;
  pcVar22 = local_d0;
LAB_0014d3c8:
  pcVar16 = pcVar22 + ((long)pcVar16 - (long)pcVar20);
  fiobj_data_pread(&local_128,h->body,(intptr_t)pcVar16,0x1000);
  if ((((uVar14 & 1) == 0) || (!bVar24)) ||
     (pcVar22 = local_128.data, pcVar15 = (char *)local_128.len, local_128.data == (char *)0x0)) {
    fiobj_free(local_100);
    return 0;
  }
  goto LAB_0014c216;
}

Assistant:

int http_parse_body(http_s *h) {
  static uint64_t content_type_hash;
  if (!h->body)
    return -1;
  if (!content_type_hash)
    content_type_hash = fiobj_hash_string("content-type", 12);
  FIOBJ ct = fiobj_hash_get2(h->headers, content_type_hash);
  fio_str_info_s content_type = fiobj_obj2cstr(ct);
  if (content_type.len < 16)
    return -1;
  if (content_type.len >= 33 &&
      !strncasecmp("application/x-www-form-urlencoded", content_type.data,
                   33)) {
    if (!h->params)
      h->params = fiobj_hash_new();
    FIOBJ tmp = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = tmp;
    return 0;
  }
  if (content_type.len >= 16 &&
      !strncasecmp("application/json", content_type.data, 16)) {
    content_type = fiobj_obj2cstr(h->body);
    if (h->params)
      return -1;
    if (fiobj_json2obj(&h->params, content_type.data, content_type.len) == 0)
      return -1;
    if (FIOBJ_TYPE_IS(h->params, FIOBJ_T_HASH))
      return 0;
    FIOBJ tmp = h->params;
    FIOBJ key = fiobj_str_new("JSON", 4);
    h->params = fiobj_hash_new2(4);
    fiobj_hash_set(h->params, key, tmp);
    fiobj_free(key);
    return 0;
  }

  http_fio_mime_s p = {.h = h};
  if (http_mime_parser_init(&p.p, content_type.data, content_type.len))
    return -1;
  if (!h->params)
    h->params = fiobj_hash_new();

  do {
    size_t cons = http_mime_parse(&p.p, p.buffer.data, p.buffer.len);
    p.pos += cons;
    p.buffer = fiobj_data_pread(h->body, p.pos, 4096);
  } while (p.buffer.data && !p.p.done && !p.p.error);
  fiobj_free(p.partial_name);
  p.partial_name = FIOBJ_INVALID;
  return 0;
}